

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

void arg_print_errors(FILE *fp,arg_end *end,char *progname)

{
  code *pcVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = (ulong)(uint)end->count;
  if (0 < end->count) {
    lVar3 = 0;
    uVar4 = uVar2;
    do {
      pcVar1 = *(code **)((long)end->parent[lVar3] + 0x50);
      if (pcVar1 != (code *)0x0) {
        (*pcVar1)(end->parent[lVar3],fp,end->error[lVar3],end->argval[lVar3],progname,pcVar1,uVar4);
        uVar2 = (ulong)(uint)end->count;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)uVar2);
  }
  return;
}

Assistant:

void arg_print_errors(FILE * fp, struct arg_end * end, const char * progname) {
	int i;
	ARG_TRACE(("arg_errors()\n"));

	for (i = 0; i < end->count; i++) {
		struct arg_hdr * errorparent = (struct arg_hdr *)(end->parent[i]);

		if (errorparent->errorfn)
			errorparent->errorfn(end->parent[i],
								 fp,
								 end->error[i],
								 end->argval[i],
								 progname);
	}
}